

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O2

void obj::remove_eol(char *ptr)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = -1;
  do {
    lVar1 = lVar3 + 1;
    lVar3 = lVar3 + 1;
  } while (ptr[lVar1] != '\0');
  while ((1 < lVar3 && (iVar2 = isspace((int)ptr[lVar3 + -1]), iVar2 != 0))) {
    ptr[lVar3 + -1] = '\0';
    lVar3 = lVar3 + -1;
  }
  return;
}

Assistant:

inline void remove_eol(char* ptr) {
    int i = 0;
    while (ptr[i]) i++;
    i--;
    while (i > 0 && std::isspace(ptr[i])) {
        ptr[i] = '\0';
        i--;
    }
}